

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

bool __thiscall
chaiscript::dispatch::Dynamic_Proxy_Function::test_guard
          (Dynamic_Proxy_Function *this,Function_Params *params,
          Type_Conversions_State *t_conversions)

{
  element_type *params_00;
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  params_00 = (this->m_guard).
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  if (params_00 == (element_type *)0x0) {
    bVar1 = true;
  }
  else {
    Proxy_Function_Base::operator()
              ((Proxy_Function_Base *)&stack0xffffffffffffffe0,(Function_Params *)params_00,
               (Type_Conversions_State *)params);
    bVar1 = boxed_cast<bool>((Boxed_Value *)&stack0xffffffffffffffe0,(Type_Conversions_State *)0x0);
    if ((pointer)local_18._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    }
  }
  return bVar1;
}

Assistant:

bool test_guard(const Function_Params &params, const Type_Conversions_State &t_conversions) const {
        if (m_guard) {
          try {
            return boxed_cast<bool>((*m_guard)(params, t_conversions));
          } catch (const exception::arity_error &) {
            return false;
          } catch (const exception::bad_boxed_cast &) {
            return false;
          }
        } else {
          return true;
        }
      }